

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::TypePrinter::print::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,char *prefix,Type type)

{
  TypePrinter *this_00;
  Type type_00;
  ostream *poVar1;
  Type *pTVar2;
  long lVar3;
  Iterator IVar4;
  Type local_48;
  Type type_local;
  Iterator __begin3;
  
  this_00 = this->this;
  local_48.id = type.id;
  poVar1 = std::operator<<(this_00->os,'(');
  std::operator<<(poVar1,prefix);
  type_local.id = (uintptr_t)&local_48;
  IVar4 = wasm::Type::end(&local_48);
  for (lVar3 = 1;
      lVar3 - IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 1
      || IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
         &local_48; lVar3 = lVar3 + 1) {
    pTVar2 = wasm::Type::Iterator::operator*((Iterator *)&type_local);
    type_00.id = pTVar2->id;
    std::operator<<(this_00->os,' ');
    TypePrinter::print(this_00,type_00);
  }
  std::operator<<(this_00->os,')');
  return;
}

Assistant:

std::ostream& TypePrinter::print(const Signature& sig) {
  auto printPrefixed = [&](const char* prefix, Type type) {
    os << '(' << prefix;
    for (Type t : type) {
      os << ' ';
      print(t);
    }
    os << ')';
  };

  os << "(func";
  if (sig.params.getID() != Type::none) {
    os << ' ';
    printPrefixed("param", sig.params);
  }
  if (sig.results.getID() != Type::none) {
    os << ' ';
    printPrefixed("result", sig.results);
  }
  return os << ')';
}